

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_check_sig_hash(mbedtls_ssl_context *ssl,mbedtls_md_type_t md)

{
  mbedtls_md_type_t mVar1;
  mbedtls_md_type_t *pmVar2;
  
  pmVar2 = (mbedtls_md_type_t *)ssl->conf->sig_hashes;
  if (pmVar2 != (mbedtls_md_type_t *)0x0) {
    mVar1 = *pmVar2;
    while (mVar1 != MBEDTLS_MD_NONE) {
      pmVar2 = pmVar2 + 1;
      if (mVar1 == md) {
        return 0;
      }
      mVar1 = *pmVar2;
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_sig_hash( const mbedtls_ssl_context *ssl,
                                mbedtls_md_type_t md )
{
    const int *cur;

    if( ssl->conf->sig_hashes == NULL )
        return( -1 );

    for( cur = ssl->conf->sig_hashes; *cur != MBEDTLS_MD_NONE; cur++ )
        if( *cur == (int) md )
            return( 0 );

    return( -1 );
}